

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O3

QList<QNetworkProxy> * __thiscall
QGlobalNetworkProxy::proxyForQuery
          (QList<QNetworkProxy> *__return_storage_ptr__,QGlobalNetworkProxy *this,
          QNetworkProxyQuery *query)

{
  QNetworkProxyFactory *pQVar1;
  qsizetype qVar2;
  QNetworkProxy *pQVar3;
  QNetworkProxyPrivate *pQVar4;
  Data *pDVar5;
  int *piVar6;
  Data *pDVar7;
  QNetworkProxy *pQVar8;
  qsizetype qVar9;
  char cVar10;
  bool bVar11;
  long in_FS_OFFSET;
  QDeadlineTimer QVar12;
  QStringView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QHostAddress parsed;
  QArrayDataPointer<QNetworkProxy> local_b8;
  char *local_a0;
  QString local_98;
  QArrayDataPointer<QNetworkProxy> local_78;
  QNetworkProxy local_60;
  QString local_58;
  QHostAddress local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar12.t2 = 0xffffffff;
  QVar12.type = 0x7fffffff;
  QVar12.t1 = (qint64)this;
  QRecursiveMutex::tryLock(QVar12);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QNetworkProxy *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_38.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_38);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxyQuery::url((QNetworkProxyQuery *)&local_b8);
  QUrl::host(&local_58,&local_b8,0x7f00000);
  QUrl::~QUrl((QUrl *)&local_b8);
  if (((((undefined1 *)local_58.d.size == (undefined1 *)0x9) &&
       (QVar13.m_data = local_58.d.ptr, QVar13.m_size = 9, QVar15.m_data = "localhost",
       QVar15.m_size = 9, cVar10 = QtPrivate::equalStrings(QVar13,QVar15), cVar10 != '\0')) ||
      (QVar14.m_data = (char *)0xa, QVar14.m_size = (qsizetype)&local_58,
      cVar10 = QString::startsWith(QVar14,0x25f0a8), cVar10 != '\0')) ||
     ((bVar11 = QHostAddress::setAddress(&local_38,&local_58), bVar11 &&
      (bVar11 = QHostAddress::isLoopback(&local_38), bVar11)))) {
LAB_001bbc40:
    local_b8.size._4_4_ = 0;
    local_b8.size._0_4_ = 0;
    local_b8.ptr._4_4_ = 0;
    local_b8.ptr._0_4_ = 0;
    local_b8.d._4_4_ = 0;
    local_b8.d._0_4_ = 0;
    local_78.size = 0;
    local_78.ptr = (QNetworkProxy *)0x0;
    local_78.d = (Data *)0x0;
    local_98.d.size = 0;
    local_98.d.ptr = (char16_t *)0x0;
    local_98.d.d = (Data *)0x0;
    QNetworkProxy::QNetworkProxy
              (&local_60,NoProxy,(QString *)&local_b8,0,(QString *)&local_78,&local_98);
    QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy>
              ((QMovableArrayOps<QNetworkProxy> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,&local_60);
    QList<QNetworkProxy>::end(__return_storage_ptr__);
  }
  else {
    pQVar1 = this->applicationLevelProxyFactory;
    if (pQVar1 == (QNetworkProxyFactory *)0x0) {
      pQVar3 = this->applicationLevelProxy;
      if (((pQVar3 != (QNetworkProxy *)0x0) &&
          (pQVar4 = (pQVar3->d).d.ptr, pQVar4 != (QNetworkProxyPrivate *)0x0)) &&
         (pQVar4->type != DefaultProxy)) {
        QtPrivate::QMovableArrayOps<QNetworkProxy>::emplace<QNetworkProxy_const&>
                  ((QMovableArrayOps<QNetworkProxy> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,pQVar3);
        QList<QNetworkProxy>::end(__return_storage_ptr__);
        goto LAB_001bbd77;
      }
      if (this->useSystemProxies == true) {
        QNetworkProxyFactory::systemProxyForQuery((QList<QNetworkProxy> *)&local_78,query);
        qVar9 = local_78.size;
        pQVar8 = local_78.ptr;
        pDVar7 = local_78.d;
        local_78.size = 0;
        local_78.d = (Data *)0x0;
        local_78.ptr = (QNetworkProxy *)0x0;
        pDVar5 = (__return_storage_ptr__->d).d;
        pQVar3 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = pDVar7;
        (__return_storage_ptr__->d).ptr = pQVar8;
        local_b8.d._0_4_ = SUB84(pDVar5,0);
        local_b8.d._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
        local_b8.ptr._0_4_ = SUB84(pQVar3,0);
        local_b8.ptr._4_4_ = (undefined4)((ulong)pQVar3 >> 0x20);
        qVar2 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = qVar9;
        local_b8.size._0_4_ = (undefined4)qVar2;
        local_b8.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
        QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_78);
      }
      goto LAB_001bbc40;
    }
    (*pQVar1->_vptr_QNetworkProxyFactory[2])(&local_78,pQVar1,query);
    qVar9 = local_78.size;
    pQVar8 = local_78.ptr;
    pDVar7 = local_78.d;
    local_78.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QNetworkProxy *)0x0;
    pDVar5 = (__return_storage_ptr__->d).d;
    pQVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = pDVar7;
    (__return_storage_ptr__->d).ptr = pQVar8;
    local_b8.d._0_4_ = SUB84(pDVar5,0);
    local_b8.d._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
    local_b8.ptr._0_4_ = SUB84(pQVar3,0);
    local_b8.ptr._4_4_ = (undefined4)((ulong)pQVar3 >> 0x20);
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = qVar9;
    local_b8.size._0_4_ = (undefined4)qVar2;
    local_b8.size._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
    QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_78);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_001bbd77;
    local_b8.d._0_4_ = 2;
    local_b8.d._4_4_ = 0;
    local_b8.ptr._0_4_ = 0;
    local_b8.ptr._4_4_ = 0;
    local_b8.size._0_4_ = 0;
    local_b8.size._4_4_ = 0;
    local_a0 = "default";
    QMessageLogger::warning
              ((char *)&local_b8,"QNetworkProxyFactory: factory %p has returned an empty result set"
               ,this->applicationLevelProxyFactory);
    local_b8.size._0_4_ = 0;
    local_b8.size._4_4_ = 0;
    local_b8.d._0_4_ = 0;
    local_b8.d._4_4_ = 0;
    local_b8.ptr._0_4_ = 0;
    local_b8.ptr._4_4_ = 0;
    local_78.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QNetworkProxy *)0x0;
    local_98.d.size = 0;
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (char16_t *)0x0;
    QNetworkProxy::QNetworkProxy
              (&local_60,NoProxy,(QString *)&local_b8,0,(QString *)&local_78,&local_98);
    QList<QNetworkProxy>::operator<<(__return_storage_ptr__,&local_60);
  }
  QNetworkProxy::~QNetworkProxy(&local_60);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
    }
  }
  piVar6 = (int *)CONCAT44(local_b8.d._4_4_,local_b8.d._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_b8.d._4_4_,local_b8.d._0_4_),2,0x10);
    }
  }
LAB_001bbd77:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QHostAddress::~QHostAddress(&local_38);
  QRecursiveMutex::unlock();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QNetworkProxy> QGlobalNetworkProxy::proxyForQuery(const QNetworkProxyQuery &query)
{
    QMutexLocker locker(&mutex);

    QList<QNetworkProxy> result;

    // don't look for proxies for a local connection
    QHostAddress parsed;
    QString hostname = query.url().host();
    if (hostname == "localhost"_L1 || hostname.startsWith("localhost."_L1)
            || (parsed.setAddress(hostname) && (parsed.isLoopback()))) {
        result << QNetworkProxy(QNetworkProxy::NoProxy);
        return result;
    }

    if (!applicationLevelProxyFactory) {
        if (applicationLevelProxy
            && applicationLevelProxy->type() != QNetworkProxy::DefaultProxy) {
            result << *applicationLevelProxy;
        } else if (useSystemProxies) {
            result = QNetworkProxyFactory::systemProxyForQuery(query);

            // Make sure NoProxy is in the list, so that QTcpServer can work:
            // it searches for the first proxy that can has the ListeningCapability capability
            // if none have (as is the case with HTTP proxies), it fails to bind.
            // NoProxy allows it to fallback to the 'no proxy' case and bind.
            result << QNetworkProxy(QNetworkProxy::NoProxy);
        } else {
            result << QNetworkProxy(QNetworkProxy::NoProxy);
        }
        return result;
    }

    // we have a factory
    result = applicationLevelProxyFactory->queryProxy(query);
    if (result.isEmpty()) {
        qWarning("QNetworkProxyFactory: factory %p has returned an empty result set",
                 applicationLevelProxyFactory);
        result << QNetworkProxy(QNetworkProxy::NoProxy);
    }
    return result;
}